

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Endpoints.cpp
# Opt level: O0

void __thiscall
helics::Endpoint::Endpoint
          (Endpoint *this,MessageFederate *mFed,string_view name,InterfaceHandle hid)

{
  string_view actName;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  pointer in_RSI;
  Federate *in_RDI;
  undefined4 in_R8D;
  InterfaceHandle unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  
  actName._M_str = in_RCX;
  actName._M_len = (size_t)in_RDX;
  Interface::Interface
            ((Interface *)CONCAT44(in_R8D,in_stack_ffffffffffffffe8),in_RDI,unaff_retaddr,actName);
  in_RDI->_vptr_Federate = (_func_int **)&PTR__Endpoint_009236e0;
  (in_RDI->configFile)._M_dataplus._M_p = in_RSI;
  *(undefined4 *)&(in_RDI->configFile)._M_string_length = 0xffffffff;
  (in_RDI->configFile).field_2._M_allocated_capacity = 0;
  (in_RDI->configFile).field_2._M_local_buf[8] = '\0';
  (in_RDI->configFile).field_2._M_local_buf[9] = '\0';
  std::__cxx11::string::string(in_RDX);
  return;
}

Assistant:

Endpoint::Endpoint(MessageFederate* mFed, std::string_view name, InterfaceHandle hid):
    Interface(mFed, hid, name), fed(mFed)
{
}